

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int escaped_string_length(char *str)

{
  int iVar1;
  int iVar2;
  int local_20;
  int local_1c;
  int to;
  int from;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    local_20 = 0;
    for (local_1c = 0; str[local_1c] != '\0'; local_1c = local_1c + 1) {
      iVar1 = local_1c;
      if (str[local_1c] == '\\') {
        iVar1 = local_1c + 1;
        iVar2 = (int)str[iVar1];
        if ((((iVar2 != 0x5c) && (1 < iVar2 - 0x61U)) && (1 < iVar2 - 0x65U)) &&
           (((iVar2 != 0x6e && (iVar2 != 0x72)) && ((iVar2 != 0x74 && (iVar2 != 0x76)))))) {
          if ((str[iVar1] < '0') || ('9' < str[iVar1])) {
            return -1;
          }
          if (((('/' < str[local_1c + 2]) && (str[local_1c + 2] < ':')) &&
              (iVar1 = local_1c + 2, '/' < str[local_1c + 3])) && (str[local_1c + 3] < ':')) {
            iVar1 = local_1c + 3;
          }
        }
      }
      local_1c = iVar1;
      local_20 = local_20 + 1;
    }
    str_local._4_4_ = local_20;
  }
  return str_local._4_4_;
}

Assistant:

static int escaped_string_length(char *str)
{
    int from;
    int to;

    if (str == NULL)
    {
        return 0;
    }

    from = 0;
    to = 0;

    while (str[from] != '\0')
    {
        if (str[from] == '\\')
        {
            from++;
            switch (str[from])
            {
                case 'e':
                case 'a':
                case 'b':
                case 'f':
                case 'n':
                case 'r':
                case 't':
                case 'v':
                case '\\':
                    to++;
                    break;
                default:
                    if (str[from] < '0' || str[from] > '9')
                    {
                        return -1;
                    }
                    if (str[from + 1] >= '0' && str[from + 1] <= '9')
                    {
                        from++;
                        if (str[from + 1] >= '0' && str[from + 1] <= '9')
                        {
                            from++;
                        }
                    }
                    to++;
            }
        }
        else
        {
            to++;
        }
        from++;
    }

    return to;
}